

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_TestBase64_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  byte bVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  ulong uVar4;
  flatcc_builder_ref_t *pfVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong *buf_00;
  flatcc_builder_t *B;
  ulong *puVar9;
  bool bVar10;
  flatcc_builder_ref_t ref;
  int more;
  int local_40;
  int local_3c;
  flatcc_builder_ref_t *local_38;
  
  *result = 0;
  iVar2 = flatcc_builder_start_table(ctx->ctx,3);
  if (iVar2 != 0) goto LAB_001122e7;
  if ((buf == end) || (*buf != '{')) {
    local_3c = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    puVar9 = (ulong *)(buf + 1);
    if ((long)end - (long)puVar9 < 2) {
LAB_00111db2:
      puVar9 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar9,end);
    }
    else if ((char)(byte)*puVar9 < '!') {
      if (((byte)*puVar9 != 0x20) || (buf[2] < '!')) goto LAB_00111db2;
      puVar9 = (ulong *)(buf + 2);
    }
    if ((puVar9 == (ulong *)end) || ((byte)*puVar9 != 0x7d)) {
      local_3c = 1;
      buf = (char *)puVar9;
    }
    else {
      local_3c = 0;
      buf = (char *)((long)puVar9 + 1);
      if ((long)end - (long)buf < 2) {
LAB_00112337:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != 0x20) || ((char)*(byte *)((long)puVar9 + 2) < '!')) goto LAB_00112337;
        buf = (char *)((long)puVar9 + 2);
      }
    }
  }
  local_38 = result;
  if (local_3c != 0) {
    do {
      if (buf != end) {
        if ((byte)*(ulong *)buf == 0x2e) {
          buf = flatcc_json_parser_set_error(ctx,buf,end,5);
        }
        else if ((byte)*(ulong *)buf == 0x22) {
          buf = (char *)((long)buf + 1);
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      uVar7 = (long)end - (long)buf;
      if (uVar7 < 8) {
        uVar4 = 0;
        switch(uVar7) {
        case 7:
          uVar4 = (long)(char)*(byte *)((long)buf + 6) << 8;
        case 6:
          uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
        case 5:
          uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
        case 4:
          uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
        case 3:
          uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
        case 2:
          uVar4 = uVar4 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
        case 1:
          uVar4 = uVar4 | (ulong)(byte)*(ulong *)buf << 0x38;
        }
      }
      else {
        uVar4 = *(ulong *)buf;
        uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                uVar4 << 0x38;
      }
      if (uVar4 < 0x6e65737465640000) {
        if ((uVar4 & 0x7fffffff00000000) == 0x6461746100000000) {
          puVar9 = (ulong *)buf;
          if (4 < (long)uVar7) {
            bVar1 = *(byte *)((long)buf + 4);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar8 = (byte *)((long)buf + 5);
                goto LAB_00112027;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar8 = (byte *)((long)buf + 4);
              ctx->unquoted = 0;
LAB_00112027:
              if ((long)end - (long)pbVar8 < 2) {
LAB_00112074:
                pbVar8 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar8,end);
              }
              else if ((char)*pbVar8 < '!') {
                if ((*pbVar8 != 0x20) || ((char)pbVar8[1] < '!')) goto LAB_00112074;
                pbVar8 = pbVar8 + 1;
              }
              if ((pbVar8 == (byte *)end) || (*pbVar8 != 0x3a)) {
                puVar9 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar8,end,4);
              }
              else {
                puVar9 = (ulong *)(pbVar8 + 1);
                if ((long)end - (long)puVar9 < 2) {
LAB_001121dd:
                  puVar9 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar9,end);
                }
                else if ((char)(byte)*puVar9 < '!') {
                  if (((byte)*puVar9 != 0x20) || ((char)pbVar8[2] < '!')) goto LAB_001121dd;
                  puVar9 = (ulong *)(pbVar8 + 2);
                }
              }
            }
          }
          bVar10 = (ulong *)buf != puVar9;
          buf = (char *)puVar9;
          if (bVar10) {
            buf = flatcc_json_parser_build_uint8_vector_base64(ctx,(char *)puVar9,end,&local_40,0);
            if (local_40 != 0) {
              B = ctx->ctx;
              iVar2 = 0;
              goto LAB_0011229e;
            }
            goto LAB_001122e7;
          }
        }
LAB_001122b6:
        buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
      }
      else {
        if (uVar4 >> 8 == 0x75726c64617461) {
          puVar9 = (ulong *)buf;
          if (7 < (long)uVar7) {
            bVar1 = *(byte *)((long)buf + 7);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                buf_00 = (ulong *)((long)buf + 8);
                goto LAB_00112056;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              buf_00 = (ulong *)((long)buf + 7);
              ctx->unquoted = 0;
LAB_00112056:
              if ((long)end - (long)buf_00 < 2) {
LAB_001120cd:
                buf_00 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
              }
              else if ((char)(byte)*buf_00 < '!') {
                if (((byte)*buf_00 != 0x20) || ((char)*(byte *)((long)buf_00 + 1) < '!'))
                goto LAB_001120cd;
                buf_00 = (ulong *)((long)buf_00 + 1);
              }
              if ((buf_00 == (ulong *)end) || ((byte)*buf_00 != 0x3a)) {
                puVar9 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_00,end,4);
              }
              else {
                puVar9 = (ulong *)((long)buf_00 + 1);
                if ((long)end - (long)puVar9 < 2) {
LAB_0011221f:
                  puVar9 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar9,end);
                }
                else if ((char)*(byte *)puVar9 < '!') {
                  if ((*(byte *)puVar9 != 0x20) || ((char)*(byte *)((long)buf_00 + 2) < '!'))
                  goto LAB_0011221f;
                  puVar9 = (ulong *)((long)buf_00 + 2);
                }
              }
            }
          }
          bVar10 = (ulong *)buf == puVar9;
          buf = (char *)puVar9;
          if (bVar10) goto LAB_001122b6;
          buf = flatcc_json_parser_build_uint8_vector_base64(ctx,(char *)puVar9,end,&local_40,1);
          if (local_40 == 0) goto LAB_001122e7;
          B = ctx->ctx;
          iVar2 = 1;
        }
        else {
          if ((uVar4 & 0xffffffffffff0000) != 0x6e65737465640000) goto LAB_001122b6;
          puVar9 = (ulong *)buf;
          if (6 < (long)uVar7) {
            bVar1 = *(byte *)((long)buf + 6);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar8 = (byte *)((long)buf + 7);
                goto LAB_00112159;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar8 = (byte *)((long)buf + 6);
              ctx->unquoted = 0;
LAB_00112159:
              if ((long)end - (long)pbVar8 < 2) {
LAB_00112177:
                pbVar8 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar8,end);
              }
              else if ((char)*pbVar8 < '!') {
                if ((*pbVar8 != 0x20) || ((char)pbVar8[1] < '!')) goto LAB_00112177;
                pbVar8 = pbVar8 + 1;
              }
              if ((pbVar8 == (byte *)end) || (*pbVar8 != 0x3a)) {
                puVar9 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar8,end,4);
              }
              else {
                puVar9 = (ulong *)(pbVar8 + 1);
                if ((long)end - (long)puVar9 < 2) {
LAB_00112263:
                  puVar9 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar9,end);
                }
                else if ((char)(byte)*puVar9 < '!') {
                  if (((byte)*puVar9 != 0x20) || ((char)pbVar8[2] < '!')) goto LAB_00112263;
                  puVar9 = (ulong *)(pbVar8 + 2);
                }
              }
            }
          }
          bVar10 = (ulong *)buf == puVar9;
          buf = (char *)puVar9;
          if (bVar10) goto LAB_001122b6;
          buf = flatcc_json_parser_build_uint8_vector_base64(ctx,(char *)puVar9,end,&local_40,0);
          if (local_40 == 0) goto LAB_001122e7;
          B = ctx->ctx;
          iVar2 = 2;
        }
LAB_0011229e:
        pfVar5 = flatcc_builder_table_add_offset(B,iVar2);
        if (pfVar5 == (flatcc_builder_ref_t *)0x0) goto LAB_001122e7;
        *pfVar5 = local_40;
      }
      buf = flatcc_json_parser_object_end(ctx,buf,end,&local_3c);
    } while (local_3c != 0);
  }
  if (ctx->error == 0) {
    fVar3 = flatcc_builder_end_table(ctx->ctx);
    *local_38 = fVar3;
    if (fVar3 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_001122e7:
  pcVar6 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar6;
}

Assistant:

static const char *MyGame_Example_TestBase64_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 3)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6e65737465640000) { /* branch "nested" */
            if ((w & 0xffffffff00000000) == 0x6461746100000000) { /* "data" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                if (mark != buf) {
                    buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 0);
                    if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                    *pref = ref;
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "data" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "data" */
        } else { /* branch "nested" */
            if ((w & 0xffffffffffffff00) == 0x75726c6461746100) { /* "urldata" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                if (mark != buf) {
                    buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 1);
                    if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                    *pref = ref;
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "urldata" */
                if ((w & 0xffffffffffff0000) == 0x6e65737465640000) { /* "nested" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                    if (mark != buf) {
                        buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 0);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 2))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "nested" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "nested" */
            } /* "urldata" */
        } /* branch "nested" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}